

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O1

cio_error cio_uart_get_flow_control(cio_uart *port,cio_uart_flow_control *flow_control)

{
  cio_error cVar1;
  cio_uart_flow_control cVar2;
  termios tty;
  
  if (port == (cio_uart *)0x0) {
    return CIO_INVALID_ARGUMENT;
  }
  cVar1 = get_current_settings(port,&tty);
  if (cVar1 != CIO_SUCCESS) {
    return cVar1;
  }
  if ((int)tty.c_cflag < 0) {
LAB_001017af:
    if ((~tty.c_iflag & 0x1c00) != 0) {
      cVar2 = CIO_UART_FLOW_CONTROL_RTS_CTS;
      goto LAB_001017d4;
    }
    if ((int)tty.c_cflag < 0) {
      return CIO_PROTOCOL_NOT_SUPPORTED;
    }
  }
  else {
    cVar2 = CIO_UART_FLOW_CONTROL_NONE;
    if ((~tty.c_iflag & 0x1c00) != 0) goto LAB_001017d4;
    if ((int)tty.c_cflag < 0) goto LAB_001017af;
  }
  if ((~tty.c_iflag & 0x1c00) != 0) {
    return CIO_PROTOCOL_NOT_SUPPORTED;
  }
  cVar2 = CIO_UART_FLOW_CONTROL_XON_XOFF;
LAB_001017d4:
  *flow_control = cVar2;
  return CIO_SUCCESS;
}

Assistant:

enum cio_error cio_uart_get_flow_control(const struct cio_uart *port, enum cio_uart_flow_control *flow_control)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	if (!cts_rts_enabled(tty.c_cflag) && !xon_xoff_enabled(tty.c_iflag)) {
		*flow_control = CIO_UART_FLOW_CONTROL_NONE;
	} else if (cts_rts_enabled(tty.c_cflag) && !xon_xoff_enabled(tty.c_iflag)) {
		*flow_control = CIO_UART_FLOW_CONTROL_RTS_CTS;
	} else if (!cts_rts_enabled(tty.c_cflag) && xon_xoff_enabled(tty.c_iflag)) {
		*flow_control = CIO_UART_FLOW_CONTROL_XON_XOFF;
	} else {
		return CIO_PROTOCOL_NOT_SUPPORTED;
	}

	return CIO_SUCCESS;
}